

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O2

string * __thiscall
booster::log::sinks::format_plain_text_message_tz_abi_cxx11_
          (string *__return_storage_ptr__,sinks *this,message *msg,int tz_offset)

{
  long lVar1;
  time_put *ptVar2;
  ostream *poVar3;
  char *pcVar4;
  int iVar5;
  ulong uVar6;
  ptime pVar7;
  string local_208;
  locale local_1e8;
  tm formatted;
  ptime local_1a8;
  ostringstream ss;
  locale alStack_c8 [3];
  long alStack_b0 [18];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  std::locale::classic();
  std::ios::imbue(&local_1e8);
  std::locale::~locale(&local_1e8);
  pVar7 = ptime::now();
  formatted._0_8_ = pVar7.sec;
  formatted.tm_hour = pVar7.nsec;
  iVar5 = (int)msg;
  pVar7 = ptime::from_number((double)iVar5);
  local_208._M_dataplus._M_p = (pointer)pVar7.sec;
  local_208._M_string_length._0_4_ = pVar7.nsec;
  pVar7 = ptime::operator+((ptime *)&formatted,(ptime *)&local_208);
  local_1a8.sec = pVar7.sec;
  local_1a8.nsec = pVar7.nsec;
  ptime::universal_time(&formatted,&local_1a8);
  std::locale::locale((locale *)&local_208,
                      (locale *)((long)&alStack_c8[0]._M_impl + *(long *)(_ss + -0x18)));
  ptVar2 = std::use_facet<std::time_put<char,std::ostreambuf_iterator<char,std::char_traits<char>>>>
                     ((locale *)&local_208);
  lVar1 = *(long *)((long)alStack_b0 + *(long *)(_ss + -0x18));
  std::time_put<char,std::ostreambuf_iterator<char,std::char_traits<char>>>::put
            (ptVar2,lVar1,lVar1 == 0,&ss + *(long *)(_ss + -0x18),0x20,&formatted,
             "%Y-%m-%d %H:%M:%S","");
  std::locale::~locale((locale *)&local_208);
  std::operator<<((ostream *)&ss," GMT");
  if (iVar5 != 0) {
    uVar6 = (ulong)(uint)-iVar5;
    if (0 < iVar5) {
      uVar6 = (ulong)msg & 0xffffffff;
    }
    poVar3 = std::operator<<((ostream *)&ss,(iVar5 < 1) * '\x02' + '+');
    std::ostream::operator<<((ostream *)poVar3,(int)(uVar6 / 0xe10));
    iVar5 = (int)((uVar6 / 0x3c) % 0x3c);
    if (iVar5 != 0) {
      poVar3 = std::operator<<((ostream *)&ss,':');
      std::ostream::operator<<((ostream *)poVar3,iVar5);
    }
  }
  std::operator<<((ostream *)&ss,";");
  poVar3 = std::operator<<((ostream *)&ss,*(char **)(this + 8));
  poVar3 = std::operator<<(poVar3,", ");
  pcVar4 = logger::level_to_string(*(level_type *)this);
  poVar3 = std::operator<<(poVar3,pcVar4);
  poVar3 = std::operator<<(poVar3,": ");
  message::log_message_abi_cxx11_(&local_208,(message *)this);
  std::operator<<(poVar3,(string *)&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  poVar3 = std::operator<<((ostream *)&ss," (");
  pcVar4 = message::file_name((message *)this);
  poVar3 = std::operator<<(poVar3,pcVar4);
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,*(int *)(this + 0x18));
  std::operator<<(poVar3,")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string format_plain_text_message_tz(message const &msg,int tz_offset)
		{
			std::ostringstream ss;
			ss.imbue(std::locale::classic());
			ptime now = ptime::now() + ptime::from_number(tz_offset);
			std::tm formatted = ptime::universal_time(now);
			static char const format[]="%Y-%m-%d %H:%M:%S";
			std::use_facet<std::time_put<char> >(ss.getloc()).put(ss,ss,' ',&formatted,format,format+sizeof(format)-1);
			ss << " GMT";
			if(tz_offset != 0) {
				char sign = tz_offset > 0 ? '+' : '-';
				if(tz_offset < 0)
					tz_offset = -tz_offset;
				int hours = tz_offset  / 3600;
				int minutes = tz_offset / 60 % 60;
				ss << sign << hours;
				if(minutes!=0)
					ss << ':' << minutes;
			}
			ss << ";";
			ss << msg.module()<<", " << logger::level_to_string(msg.level()) << ": " << msg.log_message();

			ss <<" (" << msg.file_name() <<":" <<msg.file_line() <<")";
			return ss.str();
		}